

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O2

void __thiscall OpenMD::SCDOrderParameter::process(SCDOrderParameter *this)

{
  pointer pSVar1;
  pointer pdVar2;
  pointer pSVar3;
  int iVar4;
  size_t j_1;
  long lVar5;
  size_t j;
  ulong uVar6;
  int i;
  int iVar7;
  RealType RVar8;
  DumpReader reader;
  DumpReader DStack_1288;
  
  DumpReader::DumpReader
            (&DStack_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar4 = DumpReader::getNFrames(&DStack_1288);
  for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&DStack_1288,iVar7);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    lVar5 = 0;
    for (uVar6 = 0;
        pSVar1 = (this->scdElems_).
                 super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->scdElems_).
                              super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 7);
        uVar6 = uVar6 + 1) {
      RVar8 = SCDElem::calcSCD((SCDElem *)((long)&(pSVar1->sele1_)._M_dataplus._M_p + lVar5),
                               this->currentSnapshot_);
      pdVar2 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[uVar6] = RVar8 + pdVar2[uVar6];
      lVar5 = lVar5 + 0x80;
    }
  }
  iVar7 = (this->super_StaticAnalyser).step_;
  pSVar1 = (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar6 = 0; uVar6 < (ulong)((long)pSVar1 - (long)pSVar3 >> 7); uVar6 = uVar6 + 1) {
    pdVar2[uVar6] = pdVar2[uVar6] / (double)(iVar4 / iVar7);
  }
  writeSCD(this);
  DumpReader::~DumpReader(&DStack_1288);
  return;
}

Assistant:

void SCDOrderParameter::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (std::size_t j = 0; j < scdElems_.size(); ++j) {
        scdParam_[j] += scdElems_[j].calcSCD(currentSnapshot_);
      }
    }

    int nProcessed = nFrames / step_;
    for (std::size_t j = 0; j < scdElems_.size(); ++j) {
      scdParam_[j] /= nProcessed;
    }

    writeSCD();
  }